

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_group_ops(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference ppLVar5;
  undefined1 *puVar6;
  Mat *pMVar7;
  undefined8 in_RSI;
  long in_RDI;
  bool bVar8;
  Mat weights_1 [1];
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  ParamDict *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  Mat *in_stack_fffffffffffff8c0;
  int iVar9;
  Layer *in_stack_fffffffffffff8c8;
  ParamDict *in_stack_fffffffffffff8d0;
  Mat *local_6f0;
  Mat *local_6b8;
  undefined1 *local_678;
  Mat *local_630;
  undefined1 local_5b8 [16];
  Mat local_5a8;
  undefined1 auStack_560 [24];
  Mat local_548;
  ParamDict local_500;
  _func_int **local_4f0;
  undefined4 local_4e8;
  _func_int **local_4e0;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  _func_int **local_4c0;
  undefined1 local_4b8 [24];
  ParamDict local_4a0;
  undefined8 local_490;
  int local_488;
  long *local_480;
  undefined4 local_478;
  int local_474;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  long local_460;
  ParamDict local_458;
  undefined8 local_448;
  int local_440;
  long *local_438;
  uint local_430;
  int local_42c;
  uint local_428;
  uint local_424;
  uint local_420;
  long local_418;
  void *local_400;
  int *local_3f8;
  long local_3f0;
  undefined4 local_3e8;
  long *local_3e0;
  undefined4 local_3d8;
  uint local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  long local_3c0;
  Mat local_3b8;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  undefined8 local_358;
  ParamDict *local_348;
  Mat *local_340;
  Mat *local_338;
  void **local_330;
  ParamDict *local_320;
  undefined1 *local_308;
  Mat *local_2f0;
  ParamDict *local_2e0;
  Mat *local_2d0;
  int local_2c0;
  undefined4 local_2bc;
  Mat *local_2b8;
  Mat *local_2b0;
  Mat *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  ParamDict *local_298;
  ParamDict *local_290;
  ParamDict *local_288;
  int local_280;
  undefined4 local_27c;
  Mat *local_278;
  Mat *local_270;
  Mat *local_268;
  ParamDict *local_258;
  ParamDict *local_250;
  ParamDict *local_248;
  ParamDict *local_238;
  int local_230;
  undefined4 local_22c;
  Mat *local_228;
  int local_220;
  undefined4 local_21c;
  ParamDict *local_218;
  int local_210;
  undefined4 local_20c;
  Mat *local_208;
  int local_1f0;
  undefined4 local_1ec;
  Mat *local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  ParamDict *local_1c8;
  int local_1b0;
  undefined4 local_1ac;
  Mat *local_1a8;
  int local_180;
  undefined4 local_17c;
  undefined1 *local_178;
  ParamDict *local_148;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_120;
  int local_11c;
  long *local_118;
  ParamDict *local_110;
  uint local_108;
  int local_104;
  long *local_100;
  void **local_f8;
  void *local_f0;
  void *local_c8;
  void *local_b0;
  _func_int **local_a0;
  void *local_80;
  _func_int **local_78;
  void *local_70;
  long *local_60;
  undefined4 local_54;
  long local_50;
  void *local_48;
  uint local_3c;
  void **local_38;
  long *local_30;
  int local_24;
  undefined8 local_20;
  _func_int **local_18;
  int local_c;
  ParamDict *local_8;
  
  local_35c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
  uVar2 = (long)*(int *)(in_RDI + 0x110) / (long)*(int *)(in_RDI + 0x114);
  local_360 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                    (long)local_35c) / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114))) *
              *(int *)(in_RDI + 0x114);
  local_358 = in_RSI;
  for (local_364 = 0; iVar9 = local_364,
      sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x200)),
      iVar9 < (int)sVar4; local_364 = local_364 + 1) {
    ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x200),
                         (long)local_364);
    if (*ppLVar5 != (value_type)0x0) {
      (*(*ppLVar5)->_vptr_Layer[1])();
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x15ec92d);
  local_368 = local_360 / *(int *)(in_RDI + 0x114);
  local_36c = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_stack_fffffffffffff8d0,
             (size_type)in_stack_fffffffffffff8c8);
  for (local_370 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
      local_370 < *(int *)(in_RDI + 0x114); local_370 = local_370 + 1) {
    local_100 = (long *)(in_RDI + 0x170);
    local_108 = local_35c * local_368 * local_36c;
    local_104 = local_108 * local_370;
    local_f8 = &local_400;
    local_50 = *(long *)(in_RDI + 0x180);
    local_48 = (void *)(*local_100 + local_104 * local_50);
    local_54 = *(undefined4 *)(in_RDI + 0x188);
    local_60 = *(long **)(in_RDI + 400);
    local_3f8 = (int *)0x0;
    local_3d8 = 1;
    local_3d0 = 1;
    local_3cc = 1;
    local_3c8 = 1;
    local_3c0 = (long)(int)local_108;
    local_3c = local_108;
    local_38 = local_f8;
    local_400 = local_48;
    local_3f0 = local_50;
    local_3e8 = local_54;
    local_3e0 = local_60;
    local_3d4 = local_108;
    Mat::clone(&local_3b8,(__fn *)local_f8,(void *)0x0,local_108,(void *)(ulong)local_108);
    local_330 = &local_400;
    local_128 = local_330;
    if (local_3f8 != (int *)0x0) {
      local_12c = 0xffffffff;
      LOCK();
      local_130 = *local_3f8;
      *local_3f8 = *local_3f8 + -1;
      UNLOCK();
      if (local_130 == 1) {
        if (local_3e0 == (long *)0x0) {
          local_f0 = local_400;
          if (local_400 != (void *)0x0) {
            free(local_400);
          }
        }
        else {
          (**(code **)(*local_3e0 + 0x18))();
        }
      }
    }
    local_400 = (void *)0x0;
    local_3f0 = 0;
    local_3e8 = 0;
    local_3d8 = 0;
    local_3d4 = 0;
    local_3d0 = 0;
    local_3cc = 0;
    local_3c8 = 0;
    local_3c0 = 0;
    local_3f8 = (int *)0x0;
    local_348 = &local_458;
    local_458._vptr_ParamDict = (_func_int **)0x0;
    local_448._0_4_ = 0;
    local_448._4_4_ = 0;
    local_440 = 0;
    local_438 = (long *)0x0;
    local_430 = 0;
    local_42c = 0;
    local_428 = 0;
    local_424 = 0;
    local_420 = 0;
    local_418 = 0;
    if (*(int *)(in_RDI + 0x10c) != 0) {
      local_118 = (long *)(in_RDI + 0x1b8);
      local_11c = local_36c * local_370;
      local_110 = &local_4a0;
      local_18 = (_func_int **)(*local_118 + (long)local_11c * *(long *)(in_RDI + 0x1c8));
      local_20 = *(undefined8 *)(in_RDI + 0x1c8);
      local_24 = *(int *)(in_RDI + 0x1d0);
      local_30 = *(long **)(in_RDI + 0x1d8);
      local_8 = &local_4a0;
      local_4a0._vptr_ParamDict = local_18;
      local_4a0.d = (ParamDictPrivate *)0x0;
      local_490._0_4_ = (int)local_20;
      local_490._4_4_ = SUB84(local_20,4);
      local_488 = local_24;
      local_480 = local_30;
      local_478 = 1;
      local_474 = local_36c;
      local_470 = 1;
      local_46c = 1;
      local_468 = 1;
      local_460 = (long)local_36c;
      local_250 = &local_458;
      local_258 = &local_4a0;
      bVar8 = local_250 != local_258;
      if (bVar8) {
        local_458._vptr_ParamDict = (_func_int **)0x0;
        local_448 = 0;
        local_440 = 0;
        local_430 = 0;
        local_42c = 0;
        local_428 = 0;
        local_424 = 0;
        local_420 = 0;
        local_418 = 0;
        local_458.d = (ParamDictPrivate *)0x0;
        local_458._vptr_ParamDict = local_18;
        local_458.d = (ParamDictPrivate *)0x0;
        local_448._0_4_ = (int)local_20;
        local_448._4_4_ = SUB84(local_20,4);
        local_440 = local_24;
        local_438 = local_30;
        local_430 = 1;
        local_42c = local_36c;
        local_428 = 1;
        local_424 = 1;
        local_420 = 1;
        local_238 = local_250;
        local_418 = (long)local_36c;
      }
      local_420 = (uint)bVar8;
      local_424 = (uint)bVar8;
      local_428 = (uint)bVar8;
      local_430 = (uint)bVar8;
      local_320 = &local_4a0;
      local_c = local_36c;
      local_120 = local_36c;
      local_4a0._vptr_ParamDict = (_func_int **)0x0;
      local_490._0_4_ = 0;
      local_490._4_4_ = 0;
      local_488 = 0;
      local_478 = 0;
      local_474 = 0;
      local_470 = 0;
      local_46c = 0;
      local_468 = 0;
      local_460 = 0;
      local_4a0.d = (ParamDictPrivate *)0x0;
      local_248 = local_250;
      local_148 = local_320;
    }
    local_3c0 = 0;
    local_3c8 = 0;
    local_3cc = 0;
    local_3d0 = 0;
    local_3d4 = 0;
    local_3d8 = 0;
    local_3e8 = 0;
    local_3f0 = 0;
    local_3f8 = (int *)0x0;
    local_400 = (void *)0x0;
    local_458.d = (ParamDictPrivate *)0x0;
    local_4b8._16_8_ = create_layer_cpu(in_stack_fffffffffffff8bc);
    ParamDict::ParamDict(in_stack_fffffffffffff8d0);
    ParamDict::set((ParamDict *)local_4b8,0,local_36c);
    ParamDict::set((ParamDict *)local_4b8,1,*(int *)(in_RDI + 0xd4));
    ParamDict::set((ParamDict *)local_4b8,0xb,*(int *)(in_RDI + 0xd8));
    ParamDict::set((ParamDict *)local_4b8,2,*(int *)(in_RDI + 0xdc));
    ParamDict::set((ParamDict *)local_4b8,0xc,*(int *)(in_RDI + 0xe0));
    ParamDict::set((ParamDict *)local_4b8,3,*(int *)(in_RDI + 0xe4));
    ParamDict::set((ParamDict *)local_4b8,0xd,*(int *)(in_RDI + 0xe8));
    ParamDict::set((ParamDict *)local_4b8,4,0);
    ParamDict::set((ParamDict *)local_4b8,0xe,0);
    ParamDict::set((ParamDict *)local_4b8,0x12,*(int *)(in_RDI + 0xfc));
    ParamDict::set((ParamDict *)local_4b8,0x13,*(int *)(in_RDI + 0x100));
    ParamDict::set((ParamDict *)local_4b8,5,*(int *)(in_RDI + 0x10c));
    ParamDict::set((ParamDict *)local_4b8,6,local_35c * local_368 * local_36c);
    ParamDict::set((ParamDict *)local_4b8,9,*(int *)(in_RDI + 0x118));
    ParamDict::set((ParamDict *)in_stack_fffffffffffff8c8,iVar9,
                   (Mat *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    (*(*(_func_int ***)local_4b8._16_8_)[2])(local_4b8._16_8_,local_4b8);
    if (*(int *)(in_RDI + 0x10c) == 0) {
      local_6b8 = &local_5a8;
      do {
        local_338 = local_6b8;
        local_6b8->data = (void *)0x0;
        local_6b8->refcount = (int *)0x0;
        local_6b8->elemsize = 0;
        local_6b8->elempack = 0;
        local_6b8->allocator = (Allocator *)0x0;
        local_6b8->dims = 0;
        local_6b8->w = 0;
        local_6b8->h = 0;
        local_6b8->d = 0;
        local_6b8->c = 0;
        local_6b8->cstep = 0;
        local_6b8 = local_6b8 + 1;
      } while (local_6b8 != (Mat *)auStack_560);
      local_2b8 = &local_3b8;
      local_2b0 = &local_5a8;
      if (&local_5a8 != local_2b8) {
        if (local_3b8.refcount != (int *)0x0) {
          local_2bc = 1;
          LOCK();
          local_2c0 = *local_3b8.refcount;
          *local_3b8.refcount = *local_3b8.refcount + 1;
          UNLOCK();
        }
        local_208 = &local_5a8;
        if (local_5a8.refcount != (int *)0x0) {
          local_20c = 0xffffffff;
          LOCK();
          local_210 = *local_5a8.refcount;
          *local_5a8.refcount = *local_5a8.refcount + -1;
          UNLOCK();
          if (local_210 == 1) {
            if (local_5a8.allocator == (Allocator *)0x0) {
              local_80 = local_5a8.data;
              if (local_5a8.data != (void *)0x0) {
                free(local_5a8.data);
              }
            }
            else {
              (*(local_5a8.allocator)->_vptr_Allocator[3])(local_5a8.allocator,local_5a8.data);
            }
          }
        }
        local_5a8.data = local_2b8->data;
        local_5a8.refcount = local_2b8->refcount;
        local_5a8.elemsize = local_2b8->elemsize;
        local_5a8.elempack = local_2b8->elempack;
        local_5a8.allocator = local_2b8->allocator;
        local_5a8.dims = local_2b8->dims;
        local_5a8.w = local_2b8->w;
        local_5a8.h = local_2b8->h;
        local_5a8.d = local_2b8->d;
        local_5a8.c = local_2b8->c;
        local_5a8.cstep = local_2b8->cstep;
      }
      uVar3 = local_4b8._16_8_;
      local_2a8 = &local_5a8;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff8d0,(Mat *)in_stack_fffffffffffff8c8)
      ;
      (*(*(_func_int ***)uVar3)[3])(uVar3,local_5b8);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff8b0)
      ;
      local_6f0 = (Mat *)auStack_560;
      do {
        pMVar7 = local_6f0 + -1;
        local_2f0 = pMVar7;
        local_1a8 = pMVar7;
        if (local_6f0[-1].refcount != (int *)0x0) {
          piVar1 = local_6f0[-1].refcount;
          local_1ac = 0xffffffff;
          LOCK();
          local_1b0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1b0 == 1) {
            if (local_6f0[-1].allocator == (Allocator *)0x0) {
              local_b0 = pMVar7->data;
              if (local_b0 != (void *)0x0) {
                free(local_b0);
              }
            }
            else {
              (*(local_6f0[-1].allocator)->_vptr_Allocator[3])(local_6f0[-1].allocator,pMVar7->data)
              ;
            }
          }
        }
        pMVar7->data = (void *)0x0;
        local_6f0[-1].elemsize = 0;
        local_6f0[-1].elempack = 0;
        local_6f0[-1].dims = 0;
        local_6f0[-1].w = 0;
        local_6f0[-1].h = 0;
        local_6f0[-1].d = 0;
        local_6f0[-1].c = 0;
        local_6f0[-1].cstep = 0;
        local_6f0[-1].refcount = (int *)0x0;
        local_6f0 = pMVar7;
      } while (pMVar7 != &local_5a8);
    }
    else {
      local_630 = &local_548;
      do {
        local_340 = local_630;
        local_630->data = (void *)0x0;
        local_630->refcount = (int *)0x0;
        local_630->elemsize = 0;
        local_630->elempack = 0;
        local_630->allocator = (Allocator *)0x0;
        local_630->dims = 0;
        local_630->w = 0;
        local_630->h = 0;
        local_630->d = 0;
        local_630->c = 0;
        local_630->cstep = 0;
        local_630 = local_630 + 1;
      } while (local_630 != (Mat *)local_4b8);
      local_278 = &local_3b8;
      local_270 = &local_548;
      if (&local_548 != local_278) {
        if (local_3b8.refcount != (int *)0x0) {
          local_27c = 1;
          LOCK();
          local_280 = *local_3b8.refcount;
          *local_3b8.refcount = *local_3b8.refcount + 1;
          UNLOCK();
        }
        local_228 = &local_548;
        if ((Allocator *)local_548.refcount != (Allocator *)0x0) {
          local_22c = 0xffffffff;
          LOCK();
          local_230 = *(int *)(_func_int ***)local_548.refcount;
          *(int *)(_func_int ***)local_548.refcount = *(int *)(_func_int ***)local_548.refcount + -1
          ;
          UNLOCK();
          if (local_230 == 1) {
            if (local_548.allocator == (Allocator *)0x0) {
              local_70 = local_548.data;
              if (local_548.data != (void *)0x0) {
                free(local_548.data);
              }
            }
            else {
              (*(local_548.allocator)->_vptr_Allocator[3])(local_548.allocator,local_548.data);
            }
          }
        }
        local_548.data = local_278->data;
        local_548.refcount = local_278->refcount;
        local_548.elemsize = local_278->elemsize;
        local_548.elempack = local_278->elempack;
        local_548.allocator = local_278->allocator;
        local_548.dims = local_278->dims;
        local_548.w = local_278->w;
        local_548.h = local_278->h;
        local_548.d = local_278->d;
        local_548.c = local_278->c;
        local_548.cstep = local_278->cstep;
      }
      local_298 = &local_458;
      local_290 = &local_500;
      local_268 = &local_548;
      if (&local_500 != local_298) {
        if (local_458.d != (ParamDictPrivate *)0x0) {
          local_29c = 1;
          LOCK();
          local_2a0 = (local_458.d)->params[0].type;
          (local_458.d)->params[0].type = (local_458.d)->params[0].type + 1;
          UNLOCK();
        }
        local_218 = &local_500;
        if (local_500.d != (ParamDictPrivate *)0x0) {
          local_21c = 0xffffffff;
          LOCK();
          local_220 = (local_500.d)->params[0].type;
          (local_500.d)->params[0].type = (local_500.d)->params[0].type + -1;
          UNLOCK();
          if (local_220 == 1) {
            if (local_4e0 == (_func_int **)0x0) {
              local_78 = local_500._vptr_ParamDict;
              if (local_500._vptr_ParamDict != (_func_int **)0x0) {
                free(local_500._vptr_ParamDict);
              }
            }
            else {
              (**(code **)(*local_4e0 + 0x18))(local_4e0,local_500._vptr_ParamDict);
            }
          }
        }
        local_500._vptr_ParamDict = local_298->_vptr_ParamDict;
        local_500.d = local_298->d;
        local_4f0 = local_298[1]._vptr_ParamDict;
        local_4e8 = *(undefined4 *)&local_298[1].d;
        local_4e0 = local_298[2]._vptr_ParamDict;
        local_4d8 = *(undefined4 *)&local_298[2].d;
        local_4d4 = *(undefined4 *)((long)&local_298[2].d + 4);
        local_4d0 = *(undefined4 *)&local_298[3]._vptr_ParamDict;
        local_4cc = *(undefined4 *)((long)&local_298[3]._vptr_ParamDict + 4);
        local_4c8 = *(undefined4 *)&local_298[3].d;
        local_4c0 = local_298[4]._vptr_ParamDict;
      }
      uVar3 = local_4b8._16_8_;
      local_288 = &local_500;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff8d0,(Mat *)in_stack_fffffffffffff8c8)
      ;
      (*(*(_func_int ***)uVar3)[3])(uVar3,auStack_560 + 8);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff8b0)
      ;
      local_678 = local_4b8;
      do {
        puVar6 = local_678 + -0x48;
        local_308 = puVar6;
        local_178 = puVar6;
        if (*(long *)(local_678 + -0x40) != 0) {
          piVar1 = *(int **)(local_678 + -0x40);
          local_17c = 0xffffffff;
          LOCK();
          local_180 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_180 == 1) {
            if (*(long *)(local_678 + -0x28) == 0) {
              local_c8 = *(void **)puVar6;
              if (local_c8 != (void *)0x0) {
                free(local_c8);
              }
            }
            else {
              (**(code **)(**(long **)(local_678 + -0x28) + 0x18))
                        (*(long **)(local_678 + -0x28),*(undefined8 *)puVar6);
            }
          }
        }
        *(undefined8 *)puVar6 = 0;
        *(undefined8 *)(local_678 + -0x38) = 0;
        *(undefined4 *)(local_678 + -0x30) = 0;
        *(undefined4 *)(local_678 + -0x20) = 0;
        *(undefined4 *)(local_678 + -0x1c) = 0;
        *(undefined4 *)(local_678 + -0x18) = 0;
        *(undefined4 *)(local_678 + -0x14) = 0;
        *(undefined4 *)(local_678 + -0x10) = 0;
        *(undefined8 *)(local_678 + -8) = 0;
        *(undefined8 *)(local_678 + -0x40) = 0;
        local_678 = puVar6;
      } while ((Mat *)puVar6 != &local_548);
    }
    (*(*(_func_int ***)local_4b8._16_8_)[4])(local_4b8._16_8_,local_358);
    in_stack_fffffffffffff8c8 = (Layer *)local_4b8._16_8_;
    ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x200),
                         (long)local_370);
    *ppLVar5 = in_stack_fffffffffffff8c8;
    ParamDict::~ParamDict(in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff8d0 = &local_458;
    local_2e0 = in_stack_fffffffffffff8d0;
    local_1c8 = in_stack_fffffffffffff8d0;
    if (local_458.d != (ParamDictPrivate *)0x0) {
      local_1cc = 0xffffffff;
      LOCK();
      local_1d0 = (local_458.d)->params[0].type;
      (local_458.d)->params[0].type = (local_458.d)->params[0].type + -1;
      UNLOCK();
      if (local_1d0 == 1) {
        if (local_438 == (long *)0x0) {
          local_a0 = local_458._vptr_ParamDict;
          if (local_458._vptr_ParamDict != (_func_int **)0x0) {
            free(local_458._vptr_ParamDict);
          }
        }
        else {
          (**(code **)(*local_438 + 0x18))(local_438,local_458._vptr_ParamDict);
        }
      }
    }
    in_stack_fffffffffffff8d0->_vptr_ParamDict = (_func_int **)0x0;
    in_stack_fffffffffffff8d0[1]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&in_stack_fffffffffffff8d0[1].d = 0;
    *(undefined4 *)&in_stack_fffffffffffff8d0[2].d = 0;
    *(undefined4 *)((long)&in_stack_fffffffffffff8d0[2].d + 4) = 0;
    *(undefined4 *)&in_stack_fffffffffffff8d0[3]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&in_stack_fffffffffffff8d0[3]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&in_stack_fffffffffffff8d0[3].d = 0;
    in_stack_fffffffffffff8d0[4]._vptr_ParamDict = (_func_int **)0x0;
    in_stack_fffffffffffff8d0->d = (ParamDictPrivate *)0x0;
    in_stack_fffffffffffff8c0 = &local_3b8;
    local_2d0 = in_stack_fffffffffffff8c0;
    local_1e8 = in_stack_fffffffffffff8c0;
    if (local_3b8.refcount != (int *)0x0) {
      local_1ec = 0xffffffff;
      LOCK();
      local_1f0 = *local_3b8.refcount;
      *local_3b8.refcount = *local_3b8.refcount + -1;
      UNLOCK();
      if (local_1f0 == 1) {
        if (local_3b8.allocator == (Allocator *)0x0) {
          if (local_3b8.data != (void *)0x0) {
            free(local_3b8.data);
          }
        }
        else {
          (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
        }
      }
    }
    in_stack_fffffffffffff8c0->data = (void *)0x0;
    in_stack_fffffffffffff8c0->elemsize = 0;
    in_stack_fffffffffffff8c0->elempack = 0;
    in_stack_fffffffffffff8c0->dims = 0;
    in_stack_fffffffffffff8c0->w = 0;
    in_stack_fffffffffffff8c0->h = 0;
    in_stack_fffffffffffff8c0->d = 0;
    in_stack_fffffffffffff8c0->c = 0;
    in_stack_fffffffffffff8c0->cstep = 0;
    in_stack_fffffffffffff8c0->refcount = (int *)0x0;
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}